

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  uchar uVar1;
  int iVar2;
  uchar *p;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  size_t __n;
  uint8 *pScan_line;
  uint scan_line_len;
  jpeg_decoder decoder;
  uchar *local_35a0;
  ulong local_3598;
  uint local_358c;
  jpeg_decoder local_3588;
  
  if ((actual_comps == (int *)0x0) ||
     (*actual_comps = 0,
     (req_comps == 0 || height == (int *)0x0) ||
     (width == (int *)0x0 || pStream == (jpeg_decoder_stream *)0x0))) {
    return (uchar *)0x0;
  }
  if (4 < (uint)req_comps) {
    return (uchar *)0x0;
  }
  if ((0x1aU >> (req_comps & 0x1fU) & 1) == 0) {
    return (uchar *)0x0;
  }
  jpeg_decoder::jpeg_decoder(&local_3588,pStream);
  if (local_3588.m_error_code == JPGD_SUCCESS) {
    uVar4 = (ulong)(uint)local_3588.m_image_x_size;
    local_3598 = (ulong)(uint)local_3588.m_image_y_size;
    *width = local_3588.m_image_x_size;
    *height = local_3588.m_image_y_size;
    *actual_comps = local_3588.m_comps_in_frame;
    iVar2 = jpeg_decoder::begin_decoding(&local_3588);
    if (iVar2 == 0) {
      p = (uchar *)crnlib::crnlib_malloc
                             ((long)(local_3588.m_image_x_size * req_comps * (int)local_3598));
      if (p != (uchar *)0x0) {
        if (0 < (int)local_3598) {
          __n = (size_t)(local_3588.m_image_x_size * req_comps);
          uVar7 = 0;
          puVar8 = p;
          do {
            iVar2 = jpeg_decoder::decode(&local_3588,&local_35a0,&local_358c);
            if (iVar2 != 0) {
              crnlib::crnlib_free(p);
              goto LAB_001235d5;
            }
            if (req_comps == 4) {
              if (local_3588.m_comps_in_frame == 1) {
LAB_001236fc:
                if (req_comps == 3) {
                  if (0 < local_3588.m_image_x_size) {
                    lVar6 = 0;
                    puVar3 = local_35a0;
                    do {
                      uVar1 = *puVar3;
                      puVar8[lVar6] = uVar1;
                      puVar8[lVar6 + 1] = uVar1;
                      puVar8[lVar6 + 2] = uVar1;
                      puVar3 = puVar3 + 1;
                      lVar6 = lVar6 + 3;
                    } while (uVar4 * 3 != lVar6);
                  }
                }
                else if (0 < local_3588.m_image_x_size) {
                  uVar5 = 0;
                  do {
                    uVar1 = local_35a0[uVar5];
                    puVar8[uVar5 * 4] = uVar1;
                    puVar8[uVar5 * 4 + 1] = uVar1;
                    puVar8[uVar5 * 4 + 2] = uVar1;
                    puVar8[uVar5 * 4 + 3] = 0xff;
                    uVar5 = uVar5 + 1;
                  } while (uVar4 != uVar5);
                }
              }
              else if (local_3588.m_comps_in_frame == 3) goto LAB_001236d2;
            }
            else if (req_comps == 1) {
              if (local_3588.m_comps_in_frame == 1) {
LAB_001236d2:
                memcpy(p + uVar7 * __n,local_35a0,__n);
              }
              else if ((local_3588.m_comps_in_frame == 3) && (0 < local_3588.m_image_x_size)) {
                uVar5 = 0;
                do {
                  puVar8[uVar5] =
                       (uchar)((uint)local_35a0[uVar5 * 4 + 2] * 0x1d2f +
                               (uint)local_35a0[uVar5 * 4 + 1] * 0x9646 +
                               (uint)local_35a0[uVar5 * 4] * 0x4c8b + 0x8000 >> 0x10);
                  uVar5 = uVar5 + 1;
                } while (uVar4 != uVar5);
              }
            }
            else if (local_3588.m_comps_in_frame == 3) {
              if (0 < local_3588.m_image_x_size) {
                puVar3 = local_35a0 + 2;
                lVar6 = 0;
                do {
                  puVar8[lVar6] = puVar3[-2];
                  puVar8[lVar6 + 1] = puVar3[-1];
                  puVar8[lVar6 + 2] = *puVar3;
                  puVar3 = puVar3 + 4;
                  lVar6 = lVar6 + 3;
                } while (uVar4 * 3 != lVar6);
              }
            }
            else if (local_3588.m_comps_in_frame == 1) goto LAB_001236fc;
            uVar7 = uVar7 + 1;
            puVar8 = puVar8 + __n;
          } while (uVar7 != local_3598);
        }
        goto LAB_001235d7;
      }
    }
  }
LAB_001235d5:
  p = (uchar *)0x0;
LAB_001235d7:
  jpeg_decoder::~jpeg_decoder(&local_3588);
  return p;
}

Assistant:

unsigned char* decompress_jpeg_image_from_stream(jpeg_decoder_stream* pStream, int* width, int* height, int* actual_comps, int req_comps) {
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8* pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++) {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS) {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8* pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1) {
      if (req_comps == 3) {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    } else if (decoder.get_num_components() == 3) {
      if (req_comps == 1) {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++) {
          int r = pScan_line[x * 4 + 0];
          int g = pScan_line[x * 4 + 1];
          int b = pScan_line[x * 4 + 2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          pDst[0] = pScan_line[x * 4 + 0];
          pDst[1] = pScan_line[x * 4 + 1];
          pDst[2] = pScan_line[x * 4 + 2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}